

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::ensureListView(QInputDialogPrivate *this)

{
  long lVar1;
  QInputDialog *pQVar2;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar3;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QInputDialog *q;
  QWidget *in_stack_ffffffffffffff58;
  SelectionMode mode;
  QAbstractItemView *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  QFlagsStorage<QAbstractItemView::EditTrigger> in_stack_ffffffffffffff6c;
  QInputDialogListView *this_01;
  QInputDialogPrivate *in_stack_ffffffffffffffa8;
  ConnectionType type;
  QInputDialogPrivate *receiverPrivate;
  Connection local_30 [2];
  Function in_stack_ffffffffffffffe0;
  offset_in_QItemSelectionModel_to_subr in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  receiverPrivate = in_RDI;
  pQVar2 = q_func(in_RDI);
  type = (ConnectionType)((ulong)pQVar2 >> 0x20);
  if (in_RDI->listView == (QInputDialogListView *)0x0) {
    ensureComboBox(in_stack_ffffffffffffffa8);
    this_00 = (QAbstractItemView *)operator_new(0x28);
    QInputDialogListView::QInputDialogListView
              ((QInputDialogListView *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    mode = (SelectionMode)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    in_RDI->listView = (QInputDialogListView *)this_00;
    QWidget::hide((QWidget *)0x79b17e);
    QFlags<QAbstractItemView::EditTrigger>::QFlags
              ((QFlags<QAbstractItemView::EditTrigger> *)in_stack_ffffffffffffff60,mode);
    QAbstractItemView::setEditTriggers
              (in_stack_ffffffffffffff60,(EditTriggers)in_stack_ffffffffffffff6c.i);
    QAbstractItemView::setSelectionMode(in_stack_ffffffffffffff60,mode);
    this_01 = in_RDI->listView;
    pQVar3 = QComboBox::model((QComboBox *)this_01);
    (**(code **)(*(long *)&this_01->super_QListView + 0x1c8))(this_01,pQVar3);
    QModelIndex::QModelIndex((QModelIndex *)0x79b219);
    QAbstractItemView::setCurrentIndex
              (this_00,(QModelIndex *)
                       CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68));
    QAbstractItemView::selectionModel(in_stack_ffffffffffffff60);
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QInputDialogPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
              ((Object *)currentRowChanged,in_stack_fffffffffffffff0,receiverPrivate,
               in_stack_ffffffffffffffe0,type);
    QMetaObject::Connection::~Connection(local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureListView()
{
    Q_Q(QInputDialog);
    if (!listView) {
        ensureComboBox();
        listView = new QInputDialogListView(q);
        listView->hide();
        listView->setEditTriggers(QAbstractItemView::NoEditTriggers);
        listView->setSelectionMode(QAbstractItemView::SingleSelection);
        listView->setModel(comboBox->model());
        listView->setCurrentIndex(QModelIndex()); // ###
        QObjectPrivate::connect(listView->selectionModel(),
                                &QItemSelectionModel::currentRowChanged,
                                this, &QInputDialogPrivate::currentRowChanged);
    }
}